

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUI.c
# Opt level: O0

void drawInmateSelection(Windows *win,Map *map,UnitList *inmates,UnitList *guards)

{
  int iVar1;
  Inmate *pIVar2;
  bool local_49;
  int local_3c;
  int local_38;
  int numAdded;
  int y;
  char input;
  Inmate *inmate;
  UnitList *guards_local;
  UnitList *inmates_local;
  Map *map_local;
  Windows *win_local;
  
  local_3c = 0;
  do {
    updateHeader(win->header,map);
    wrefresh(win->header);
    numAdded._3_1_ = wgetch(win->body);
    switch(numAdded._3_1_) {
    case 'a':
      if (map->repMax < 0x1e) {
        mvwprintw(win->footer,0,0x28,"INSUFICIENT FUNDS");
      }
      else {
        mvwprintw(win->footer,0,0x28,"ATTORNEY ADDED");
        pIVar2 = createInmate((int)numAdded._3_1_);
        map->repMax = map->repMax + -0x1e;
        enqueue(inmates,pIVar2);
        local_3c = local_3c + 1;
        updateQueue(win->body,inmates,local_3c);
      }
      break;
    case 'b':
      if (map->repMax < 0x10) {
        mvwprintw(win->footer,0,0x28,"INSUFICIENT FUNDS");
      }
      else {
        mvwprintw(win->footer,0,0x28,"BRUISER ADDED");
        pIVar2 = createInmate((int)numAdded._3_1_);
        map->repMax = map->repMax + -0x10;
        enqueue(inmates,pIVar2);
        local_3c = local_3c + 1;
        updateQueue(win->body,inmates,local_3c);
      }
      break;
    case 'c':
      if (map->repMax < 0x14) {
        mvwprintw(win->footer,0,0x28,"INSUFICIENT FUNDS");
      }
      else {
        mvwprintw(win->footer,0,0x28,"CUTIE ADDED");
        pIVar2 = createInmate((int)numAdded._3_1_);
        map->repMax = map->repMax + -0x14;
        enqueue(inmates,pIVar2);
        local_3c = local_3c + 1;
        updateQueue(win->body,inmates,local_3c);
      }
      break;
    case 'd':
      if (map->repMax < 10) {
        mvwprintw(win->footer,0,0x28,"INSUFICIENT FUNDS");
      }
      else {
        mvwprintw(win->footer,0,0x28,"DOCTOR ADDED");
        pIVar2 = createInmate((int)numAdded._3_1_);
        map->repMax = map->repMax + -10;
        enqueue(inmates,pIVar2);
        local_3c = local_3c + 1;
        updateQueue(win->body,inmates,local_3c);
      }
      break;
    default:
      mvwprintw(win->footer,0,0x28,"INMATE NOT FOUND");
      break;
    case 'f':
      if (map->repMax < 0x3c) {
        mvwprintw(win->footer,0,0x28,"INSUFICIENT FUNDS");
      }
      else {
        mvwprintw(win->footer,0,0x28,"FATTY ADDED");
        pIVar2 = createInmate((int)numAdded._3_1_);
        map->repMax = map->repMax + -0x3c;
        enqueue(inmates,pIVar2);
        local_3c = local_3c + 1;
        updateQueue(win->body,inmates,local_3c);
      }
      break;
    case 'h':
      if (map->repMax < 10) {
        mvwprintw(win->footer,0,0x28,"INSUFICIENT FUNDS");
      }
      else {
        mvwprintw(win->footer,0,0x28,"HOMEBOY ADDED");
        map->repMax = map->repMax + -10;
        pIVar2 = createInmate((int)numAdded._3_1_);
        enqueue(inmates,pIVar2);
        local_3c = local_3c + 1;
        updateQueue(win->body,inmates,local_3c);
      }
      break;
    case 'l':
      if (map->repMax < 0x10) {
        mvwprintw(win->footer,0,0x28,"INSUFICIENT FUNDS");
      }
      else {
        mvwprintw(win->footer,0,0x28,"LUNATIC ADDED");
        pIVar2 = createInmate((int)numAdded._3_1_);
        map->repMax = map->repMax + -0x10;
        enqueue(inmates,pIVar2);
        local_3c = local_3c + 1;
        updateQueue(win->body,inmates,local_3c);
      }
      break;
    case 's':
      if (9 < map->repMax) {
        mvwprintw(win->footer,0,0x28,"SPEEDY ADDED");
        pIVar2 = createInmate((int)numAdded._3_1_);
        map->repMax = map->repMax + -10;
        enqueue(inmates,pIVar2);
        local_3c = local_3c + 1;
        updateQueue(win->body,inmates,local_3c);
      }
    }
    if (map->repMax < 10) {
      mvwprintw(win->footer,0,0x14,"INSUFICIENT FUNDS");
      wrefresh(win->footer);
      wgetch(win->body);
      break;
    }
    if ((numAdded._3_1_ == '\n') && (local_3c == 0)) {
      mvwprintw(win->footer,0,0x1e,"Please select at least one unit");
      numAdded._3_1_ = ' ';
    }
    else if (numAdded._3_1_ == '\n') break;
    wrefresh(win->footer);
    for (local_38 = 0x1e; local_38 < 0x4b; local_38 = local_38 + 1) {
      iVar1 = wmove(win->footer,0,local_38);
      if (iVar1 != -1) {
        waddch(win->footer);
      }
    }
    local_49 = numAdded._3_1_ != '\n' && local_3c < 5;
  } while (local_49);
  for (local_38 = 1; local_38 < 0x4b; local_38 = local_38 + 1) {
    iVar1 = wmove(win->footer,0,local_38);
    if (iVar1 != -1) {
      waddch(win->footer);
    }
  }
  for (local_38 = 1; local_38 < 0x4b; local_38 = local_38 + 1) {
    iVar1 = wmove(win->body,0x10,local_38);
    if (iVar1 != -1) {
      waddch(win->body,0x20);
    }
  }
  wrefresh(win->footer);
  wrefresh(win->body);
  return;
}

Assistant:

void drawInmateSelection(struct Windows *win, struct Map *map,
    struct UnitList *inmates, struct UnitList *guards) {
    struct Inmate *inmate;
    char input;
    int y;
    int numAdded = 0;
//
//    mvwprintw(win->body, MAP_ROWS, 3,
//        "Press the corresponding letter to buy inmate");
//    mvwprintw(win->footer, 0, 3, "Press \"Enter\" to play:");
    do {
        updateHeader(win->header, map);
        wrefresh(win->header);
        input = wgetch(win->body);
        switch (input) {
            case 'h':
                if (map->repMax >= 10) {
                    mvwprintw(win->footer, 0, 40, "HOMEBOY ADDED");
                    map->repMax -= 10;
                    inmate = createInmate(input);
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                else {
                    mvwprintw(win->footer, 0, 40, "INSUFICIENT FUNDS");
                }
                break;
            case 'b':
                if (map->repMax >= 16) {
                    mvwprintw(win->footer, 0, 40, "BRUISER ADDED");
                    inmate = createInmate(input);
                    map->repMax -= 16;
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                else {
                    mvwprintw(win->footer, 0, 40, "INSUFICIENT FUNDS");
                }
                break;
            case 'l':
                if (map->repMax >= 16) {
                    mvwprintw(win->footer, 0, 40, "LUNATIC ADDED");
                    inmate = createInmate(input);
                    map->repMax -= 16;
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                else {
                    mvwprintw(win->footer, 0, 40, "INSUFICIENT FUNDS");
                }
                break;
            case 'f':
                if (map->repMax >= 60) {
                    mvwprintw(win->footer, 0, 40, "FATTY ADDED");
                    inmate = createInmate(input);
                    map->repMax -= 60;
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                else {
                    mvwprintw(win->footer, 0, 40, "INSUFICIENT FUNDS");
                }
                break;
            case 's':
                if (map->repMax >= 10) {
                    mvwprintw(win->footer, 0, 40, "SPEEDY ADDED");
                    inmate = createInmate(input);
                    map->repMax -= 10;
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                break;
            case 'c':
                if (map->repMax >= 20) {
                    mvwprintw(win->footer, 0, 40, "CUTIE ADDED");
                    inmate = createInmate(input);
                    map->repMax -= 20;
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                else {
                    mvwprintw(win->footer, 0, 40, "INSUFICIENT FUNDS");
                }
                break;
            case 'a':
                if (map->repMax >= 30) {
                    mvwprintw(win->footer, 0, 40, "ATTORNEY ADDED");
                    inmate = createInmate(input);
                    map->repMax -= 30;
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                else {
                    mvwprintw(win->footer, 0, 40, "INSUFICIENT FUNDS");
                }
                break;
            case 'd':
                if (map->repMax >= 10) {
                    mvwprintw(win->footer, 0, 40, "DOCTOR ADDED");
                    inmate = createInmate(input);
                    map->repMax -= 10;
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                else {
                    mvwprintw(win->footer, 0, 40, "INSUFICIENT FUNDS");
                }
                break;
            default:
                mvwprintw(win->footer, 0, 40, "INMATE NOT FOUND");
        }
        if (map->repMax < 10) {
            mvwprintw(win->footer, 0, 20, "INSUFICIENT FUNDS");
            wrefresh(win->footer);
            wgetch(win->body);
            break;
        }
        if (input == '\n' && numAdded == 0) {
            mvwprintw(win->footer, 0, 30, "Please select at least one unit");
            input = ' ';
        }
        else if (input == '\n') {
            break;
        }
        wrefresh(win->footer);
        for (y = 30; y < MAX_COLS - 5; y++) {
            mvwaddch(win->footer, 0, y, ACS_HLINE);
        }
    } while (input != '\n' && numAdded < 5);
    for (y = 1; y < MAX_COLS - 5; y++) {
        mvwaddch(win->footer, 0, y, ACS_HLINE);
    }
    for (y = 1; y < MAX_COLS - 5; y++) {
        mvwaddch(win->body, MAP_ROWS, y, ' ');
    }
    wrefresh(win->footer);
    wrefresh(win->body);
}